

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O1

ConversionResult
convertUTF::ConvertUTF16toUTF32
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  ushort uVar1;
  bool bVar2;
  ConversionResult CVar3;
  ushort *puVar4;
  int iVar5;
  UTF32 *pUVar6;
  UTF16 *oldSource;
  ushort *puVar7;
  UTF32 UVar8;
  
  pUVar6 = *targetStart;
  CVar3 = conversionOK;
  puVar7 = *sourceStart;
  do {
    puVar4 = puVar7;
    if (sourceEnd <= puVar7) break;
    puVar4 = puVar7 + 1;
    uVar1 = *puVar7;
    UVar8 = (UTF32)uVar1;
    if ((uVar1 & 0xfc00) == 0xd800) {
      if (puVar4 < sourceEnd) {
        if ((*puVar4 & 0xfc00) == 0xdc00) {
          UVar8 = (uint)uVar1 * 0x400 + (uint)*puVar4 + 0xfca02400;
          puVar4 = puVar7 + 2;
LAB_00182fa8:
          iVar5 = 0;
          bVar2 = true;
        }
        else {
          if (flags != strictConversion) goto LAB_00182fa8;
          CVar3 = sourceIllegal;
          bVar2 = false;
          iVar5 = 3;
          puVar4 = puVar7;
        }
        if (bVar2) goto LAB_00182fb0;
      }
      else {
        iVar5 = 3;
        CVar3 = sourceExhausted;
        puVar4 = puVar7;
      }
    }
    else {
      if ((flags == strictConversion) && (iVar5 = 3, (uVar1 & 0xfc00) == 0xdc00)) {
        CVar3 = sourceIllegal;
        puVar4 = puVar7;
        goto LAB_00182fcd;
      }
LAB_00182fb0:
      if (pUVar6 < targetEnd) {
        *pUVar6 = UVar8;
        pUVar6 = pUVar6 + 1;
        iVar5 = 0;
      }
      else {
        iVar5 = 3;
        CVar3 = targetExhausted;
        puVar4 = puVar7;
      }
    }
LAB_00182fcd:
    puVar7 = puVar4;
  } while (iVar5 == 0);
  *sourceStart = puVar4;
  *targetStart = pUVar6;
  return CVar3;
}

Assistant:

ConversionResult ConvertUTF16toUTF32(const UTF16** sourceStart, const UTF16* sourceEnd, UTF32** targetStart,
                                     const UTF32* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF16* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd)
    {
        const UTF16* oldSource = source; /*  In case we have to back up because of target overflow. */
        UTF32 ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END)
        {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd)
            {
                UTF32 ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END)
                {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift) + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                }
                else if (flags == ConversionFlags::strictConversion)
                {             /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
            }
            else
            {             /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = ConversionResult::sourceExhausted;
                break;
            }
        }
        else if (flags == ConversionFlags::strictConversion)
        {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END)
            {
                --source; /* return to the illegal value itself */
                result = ConversionResult::sourceIllegal;
                break;
            }
        }
        if (target >= targetEnd)
        {
            source = oldSource; /* Back up source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        *target++ = ch;
    }
    *sourceStart = source;
    *targetStart = target;
#ifdef CVTUTF_DEBUG
    if (result == sourceIllegal)
    {
        fprintf(stderr, "ConvertUTF16toUTF32 illegal seq 0x%04x,%04x\n", ch, ch2);
        fflush(stderr);
    }
#endif
    return result;
}